

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaneMap.h
# Opt level: O3

void __thiscall PlaneMap::PlaneMap(PlaneMap *this,Vector *n,Vector *e1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  (this->super_Map)._vptr_Map = (_func_int **)&PTR__Map_0010a940;
  dVar1 = n->z;
  dVar2 = e1->z;
  dVar5 = n->x;
  dVar3 = n->y;
  dVar4 = e1->y;
  dVar6 = dVar1 * dVar2 + dVar5 * e1->x + dVar3 * dVar4;
  auVar7._0_8_ = dVar6 * dVar5;
  auVar7._8_8_ = dVar6 * dVar3;
  dVar5 = dVar1 * dVar1 + dVar5 * dVar5 + dVar3 * dVar3;
  auVar8._8_8_ = dVar5;
  auVar8._0_8_ = dVar5;
  auVar8 = divpd(auVar7,auVar8);
  (this->eu).x = e1->x - auVar8._0_8_;
  (this->eu).y = dVar4 - auVar8._8_8_;
  (this->eu).z = dVar2 - (dVar1 * dVar6) / dVar5;
  dVar1 = e1->x;
  dVar2 = n->x;
  dVar5 = n->y;
  dVar3 = n->z;
  dVar4 = e1->y;
  dVar6 = e1->z;
  (this->ev).x = dVar6 * dVar5 - dVar3 * dVar4;
  (this->ev).y = dVar1 * dVar3 - dVar2 * dVar6;
  (this->ev).z = dVar2 * dVar4 - dVar1 * dVar5;
  return;
}

Assistant:

PlaneMap(Vector const& n, Vector const& e1)
        : eu( e1 - n * (n & e1) / (n & n) )
        , ev( n ^ e1 )
    {}